

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collision_frontend.cpp
# Opt level: O3

void __thiscall
CollisionFrontend::print_broad_clash_counts
          (CollisionFrontend *this,Structure *Conf,vector<int,_std::allocator<int>_> *starts,
          vector<int,_std::allocator<int>_> *ends,bool b_ignore_self)

{
  AtomFlavor AVar1;
  uint uVar2;
  uint uVar3;
  Residue *pRVar4;
  Atom *pAVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  ulong uVar9;
  short sVar10;
  ushort uVar11;
  __node_base _Var12;
  ostream *poVar13;
  long *plVar14;
  pointer piVar15;
  long lVar16;
  Residue *pRVar17;
  uint *puVar18;
  char *__function;
  int iVar19;
  short sVar20;
  short sVar21;
  char *__file;
  int iVar22;
  char *__assertion;
  undefined7 in_register_00000081;
  short sVar23;
  uint uVar24;
  ulong uVar25;
  undefined2 uVar26;
  long lVar27;
  int iVar28;
  Atom *pAVar29;
  filter_results_t nearby_atoms;
  undefined2 local_12e;
  short local_12c;
  undefined2 local_12a;
  int local_128 [2];
  undefined8 uStack_120;
  undefined8 local_118;
  int local_108;
  uint local_104;
  int local_100;
  int local_fc;
  ulong local_f8;
  Structure *local_f0;
  int local_e8;
  int local_e4;
  ulong local_e0;
  CollisionFrontend *local_d8;
  ulong local_d0;
  int local_c4;
  int local_c0;
  undefined4 local_bc;
  vector<collision_grid_prot::atom_key,_std::allocator<collision_grid_prot::atom_key>_> local_b8;
  vector<int,_std::allocator<int>_> *local_a0;
  long local_98;
  vector<int,_std::allocator<int>_> *local_90;
  long local_88;
  long local_80;
  collision_grid *local_78;
  Membrane *local_70;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_bc = (undefined4)CONCAT71(in_register_00000081,b_ignore_self);
  local_f0 = Conf;
  local_d8 = this;
  local_a0 = ends;
  if ((long)(starts->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)(starts->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start !=
      (long)(ends->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)(ends->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start) {
    __assert_fail("starts.size() == ends.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/collision_frontend.cpp"
                  ,0x1e5,
                  "void CollisionFrontend::print_broad_clash_counts(const class Structure &, const std::vector<int> &, const std::vector<int> &, const bool) const"
                 );
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"res,bbc,scc,tot,mc\n",0x13);
  local_128[0] = 0;
  local_128[1] = 0;
  uStack_120 = 0;
  local_118 = 0;
  lVar16 = (long)(starts->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(starts->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  if (lVar16 == 0) {
    iVar22 = 0;
    iVar28 = 0;
    iVar19 = 0;
  }
  else {
    lVar16 = lVar16 >> 2;
    local_70 = &local_d8->m_membrane;
    local_78 = &(local_d8->m_broad_phase).m_impl;
    local_98 = lVar16 + (ulong)(lVar16 == 0);
    piVar15 = (local_a0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    local_12e = 0;
    local_12c = 0;
    sVar20 = 0;
    uVar26 = 0;
    local_104 = 0;
    local_e4 = 0;
    local_e8 = 0;
    iVar28 = 0;
    iVar22 = 0;
    lVar16 = 0;
    local_90 = starts;
    do {
      uVar24 = (local_90->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[lVar16];
      uVar25 = (ulong)(int)uVar24;
      local_88 = lVar16;
      if (uVar24 <= (uint)piVar15[lVar16]) {
        do {
          if (uVar25 != (long)local_f0->_res[uVar25]._posn) {
            uStack_120 = CONCAT62(uStack_120._2_6_,local_12e);
            local_118._0_6_ = CONCAT24(local_12c,(undefined4)local_118);
            __assert_fail("res._posn == i_res",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/collision_frontend.cpp"
                          ,0x1fd,
                          "void CollisionFrontend::print_broad_clash_counts(const class Structure &, const std::vector<int> &, const std::vector<int> &, const bool) const"
                         );
          }
          pRVar17 = local_f0->_res + uVar25;
          sVar10 = pRVar17->_numAtom;
          local_d0 = uVar25;
          local_c4 = iVar28;
          local_c0 = iVar22;
          if (sVar10 < 1) {
            local_f8 = 0;
            local_12a = local_12e;
            local_e0 = 0;
            local_108 = 0;
            sVar21 = local_12c;
          }
          else {
            local_fc = (int)uVar25 + -2;
            uVar24 = 0;
            local_108 = 0;
            local_e0 = 0;
            local_f8 = 0;
            local_100 = local_e4;
            sVar21 = sVar20;
            local_12a = uVar26;
            local_80 = uVar25 * 0x150;
            do {
              iVar19 = local_108;
              pAVar29 = pRVar17->_atom;
              bVar7 = pAVar29[(int)uVar24].super_Point.x != 0.0;
              bVar8 = pAVar29[(int)uVar24].super_Point.y != 0.0;
              bVar6 = pAVar29[(int)uVar24].super_Point.z != 0.0;
              iVar22 = pAVar29[(int)uVar24]._type;
              if (iVar22 < 1 && (bVar6 || (bVar8 || bVar7))) {
LAB_0011af59:
                uStack_120 = CONCAT62(uStack_120._2_6_,local_12e);
                local_118._0_6_ = CONCAT24(local_12c,(undefined4)local_118);
                __assert_fail("atom.is_at_origin() || (atom._type > 0)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/vdw_utils.h"
                              ,0x36,"static unsigned int VdwUtils::should_ignore_atom(const Atom &)"
                             );
              }
              if (0x1d < iVar22 && (bVar6 || (bVar8 || bVar7))) {
LAB_0011af26:
                uStack_120 = CONCAT62(uStack_120._2_6_,local_12e);
                local_118._0_6_ = CONCAT24(local_12c,(undefined4)local_118);
                __assert_fail("atom.is_at_origin() || (atom._type < DISGRO_MAX_ATOM_TYPES)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/vdw_utils.h"
                              ,0x37,"static unsigned int VdwUtils::should_ignore_atom(const Atom &)"
                             );
              }
              if (((bVar6 || (bVar8 || bVar7)) &&
                  (VdwUtils::disgro_atom_type_to_CHONS[iVar22] != AF_H)) &&
                 (VdwUtils::disgro_atom_type_to_CHONS[iVar22] != AF_UNDEF)) {
                if (uVar24 < 6) {
                  iVar22 = (int)local_d0;
                  local_128[0] = iVar22;
                  if ((long)local_d0 < 1) {
                    uStack_120 = CONCAT62(uStack_120._2_6_,local_12e);
                    local_118._0_6_ = CONCAT24(local_12c,(undefined4)local_118);
                    __assert_fail("infos[e1_3_gobbo].res_ix >= 1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/collision_frontend.cpp"
                                  ,0x211,
                                  "void CollisionFrontend::print_broad_clash_counts(const class Structure &, const std::vector<int> &, const std::vector<int> &, const bool) const"
                                 );
                  }
                  if (local_f0->_numRes < iVar22) {
                    uStack_120 = CONCAT62(uStack_120._2_6_,local_12e);
                    local_118._0_6_ = CONCAT24(local_12c,(undefined4)local_118);
                    __assert_fail("infos[e1_3_gobbo].res_ix <= Conf._numRes",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/collision_frontend.cpp"
                                  ,0x212,
                                  "void CollisionFrontend::print_broad_clash_counts(const class Structure &, const std::vector<int> &, const std::vector<int> &, const bool) const"
                                 );
                  }
                  local_128[1] = uVar24;
                  local_12a = *(undefined2 *)((long)local_f0->_res->_scChi + local_80 + -0x20);
                  local_104 = uVar24;
                  local_100 = iVar22;
                  local_e4 = iVar22;
                }
                pAVar29 = pAVar29 + (int)uVar24;
                iVar22 = Membrane::collides(local_70,pAVar29,local_d8->m_ofac2[2]);
                local_b8.
                super__Vector_base<collision_grid_prot::atom_key,_std::allocator<collision_grid_prot::atom_key>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_b8.
                super__Vector_base<collision_grid_prot::atom_key,_std::allocator<collision_grid_prot::atom_key>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_b8.
                super__Vector_base<collision_grid_prot::atom_key,_std::allocator<collision_grid_prot::atom_key>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                uVar11 = (ushort)pAVar29->_type;
                if ((short)uVar11 < 1) {
                  uStack_120 = CONCAT62(uStack_120._2_6_,local_12e);
                  local_118._0_6_ = CONCAT24(local_12c,(undefined4)local_118);
                  __assert_fail("dg_atom_type > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/vdw_utils.h"
                                ,0x88,"double DG_ATOM_TYPE_TO_VDW_RADIUS(const short)");
                }
                if (0x1d < uVar11) {
                  uStack_120 = CONCAT62(uStack_120._2_6_,local_12e);
                  local_118._0_6_ = CONCAT24(local_12c,(undefined4)local_118);
                  __assert_fail("dg_atom_type < DISGRO_MAX_ATOM_TYPES",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/vdw_utils.h"
                                ,0x89,"double DG_ATOM_TYPE_TO_VDW_RADIUS(const short)");
                }
                AVar1 = VdwUtils::disgro_atom_type_to_CHONS[pAVar29->_type & 0x1f];
                if ((long)(int)AVar1 < 0) {
                  uStack_120 = CONCAT62(uStack_120._2_6_,local_12e);
                  local_118._0_6_ = CONCAT24(local_12c,(undefined4)local_118);
                  __assert_fail("VdwUtils::disgro_atom_type_to_CHONS[dg_atom_type] >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/vdw_utils.h"
                                ,0x8a,"double DG_ATOM_TYPE_TO_VDW_RADIUS(const short)");
                }
                if (AF_UNDEF < AVar1) {
                  local_118._0_6_ = CONCAT24(local_12c,(undefined4)local_118);
                  __assertion = 
                  "VdwUtils::disgro_atom_type_to_CHONS[dg_atom_type] < VdwUtils::AF_NUM";
                  __file = 
                  "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/vdw_utils.h"
                  ;
                  __function = "double DG_ATOM_TYPE_TO_VDW_RADIUS(const short)";
LAB_0011b115:
                  uStack_120 = CONCAT62(uStack_120._2_6_,local_12e);
                  __assert_fail(__assertion,__file,0x8b,__function);
                }
                local_68._M_buckets = &local_68._M_single_bucket;
                local_68._M_bucket_count = 1;
                local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
                local_68._M_element_count = 0;
                local_68._M_rehash_policy._M_max_load_factor = 1.0;
                local_68._M_rehash_policy._M_next_resize = 0;
                local_68._M_single_bucket = (__node_base_ptr)0x0;
                collision_grid::filter
                          (local_78,(element_set_t *)&local_68,(pAVar29->super_Point).x,
                           (pAVar29->super_Point).y,(pAVar29->super_Point).z,
                           VdwUtils::atom_flavor_to_vdw_radius[(int)AVar1]);
                if ((local_68._M_element_count != 0) &&
                   (std::
                    vector<collision_grid_prot::atom_key,_std::allocator<collision_grid_prot::atom_key>_>
                    ::resize(&local_b8,local_68._M_element_count),
                   local_68._M_before_begin._M_nxt != (_Hash_node_base *)0x0)) {
                  puVar18 = &(local_b8.
                              super__Vector_base<collision_grid_prot::atom_key,_std::allocator<collision_grid_prot::atom_key>_>
                              ._M_impl.super__Vector_impl_data._M_start)->atom_ix;
                  _Var12._M_nxt = local_68._M_before_begin._M_nxt;
                  do {
                    uVar2 = *(uint *)&_Var12._M_nxt[1]._M_nxt;
                    *puVar18 = uVar2 & 0xf;
                    ((atom_key *)(puVar18 + -1))->res_ix = uVar2 >> 4;
                    _Var12._M_nxt = (_Var12._M_nxt)->_M_nxt;
                    puVar18 = puVar18 + 2;
                  } while (_Var12._M_nxt != (_Hash_node_base *)0x0);
                }
                local_108 = (iVar19 + 1) - (uint)(iVar22 == 0);
                std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::~_Hashtable(&local_68);
                if ((long)local_b8.
                          super__Vector_base<collision_grid_prot::atom_key,_std::allocator<collision_grid_prot::atom_key>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_b8.
                          super__Vector_base<collision_grid_prot::atom_key,_std::allocator<collision_grid_prot::atom_key>_>
                          ._M_impl.super__Vector_impl_data._M_start != 0) {
                  lVar27 = (long)local_b8.
                                 super__Vector_base<collision_grid_prot::atom_key,_std::allocator<collision_grid_prot::atom_key>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_b8.
                                 super__Vector_base<collision_grid_prot::atom_key,_std::allocator<collision_grid_prot::atom_key>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3;
                  lVar16 = 0;
                  sVar20 = sVar21;
                  do {
                    uVar2 = local_b8.
                            super__Vector_base<collision_grid_prot::atom_key,_std::allocator<collision_grid_prot::atom_key>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar16].res_ix;
                    uVar25 = (ulong)uVar2;
                    uVar26 = local_118._6_2_;
                    if (uVar25 == 0) {
                      uStack_120 = CONCAT62(uStack_120._2_6_,local_12e);
                      local_118._0_6_ = CONCAT24(local_12c,(undefined4)local_118);
                      __assert_fail("nearby_atom_key.res_ix >= 1",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/collision_frontend.cpp"
                                    ,0x226,
                                    "void CollisionFrontend::print_broad_clash_counts(const class Structure &, const std::vector<int> &, const std::vector<int> &, const bool) const"
                                   );
                    }
                    if ((uint)local_f0->_numRes < uVar2) {
                      uStack_120 = CONCAT62(uStack_120._2_6_,local_12e);
                      local_118._0_6_ = CONCAT24(local_12c,(undefined4)local_118);
                      __assert_fail("nearby_atom_key.res_ix <= static_cast<unsigned int>(Conf._numRes)"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/collision_frontend.cpp"
                                    ,0x227,
                                    "void CollisionFrontend::print_broad_clash_counts(const class Structure &, const std::vector<int> &, const std::vector<int> &, const bool) const"
                                   );
                    }
                    uVar3 = local_b8.
                            super__Vector_base<collision_grid_prot::atom_key,_std::allocator<collision_grid_prot::atom_key>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar16].atom_ix;
                    pRVar4 = local_f0->_res;
                    if ((uint)(int)pRVar4[uVar25]._numAtom <= uVar3) {
                      uStack_120 = CONCAT62(uStack_120._2_6_,local_12e);
                      local_118._0_6_ = CONCAT24(local_12c,(undefined4)local_118);
                      __assert_fail("nearby_atom_key.atom_ix < static_cast<unsigned int>(Conf._res[nearby_atom_key.res_ix]._numAtom)"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/collision_frontend.cpp"
                                    ,0x229,
                                    "void CollisionFrontend::print_broad_clash_counts(const class Structure &, const std::vector<int> &, const std::vector<int> &, const bool) const"
                                   );
                    }
                    pAVar5 = pRVar4[uVar25]._atom;
                    bVar7 = pAVar5[uVar3].super_Point.x == 0.0;
                    bVar8 = pAVar5[uVar3].super_Point.y == 0.0;
                    bVar6 = pAVar5[uVar3].super_Point.z == 0.0;
                    iVar22 = pAVar5[uVar3]._type;
                    if (iVar22 < 1 && (!bVar6 || (!bVar8 || !bVar7))) goto LAB_0011af59;
                    if (0x1d < iVar22 && (!bVar6 || (!bVar8 || !bVar7))) goto LAB_0011af26;
                    if (((bVar6 && (bVar8 && bVar7)) ||
                        (VdwUtils::disgro_atom_type_to_CHONS[iVar22] == AF_UNDEF)) ||
                       (VdwUtils::disgro_atom_type_to_CHONS[iVar22] == AF_H)) {
                      uStack_120 = CONCAT62(uStack_120._2_6_,local_12e);
                      local_118._0_6_ = CONCAT24(local_12c,(undefined4)local_118);
                      __assert_fail("!VdwUtils::should_ignore_atom(nearby_atom)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/collision_frontend.cpp"
                                    ,0x22b,
                                    "void CollisionFrontend::print_broad_clash_counts(const class Structure &, const std::vector<int> &, const std::vector<int> &, const bool) const"
                                   );
                    }
                    sVar21 = sVar20;
                    if (((byte)local_bc & local_d0 == uVar25) != 0) goto LAB_0011ab4a;
                    if (uVar24 < 6) {
                      uStack_120 = CONCAT44(uVar2,(undefined4)uStack_120);
                      local_118 = CONCAT44(local_118._4_4_,uVar3);
                      if ((int)local_104 < 0) {
                        local_118._0_6_ = CONCAT24(local_12c,uVar3);
                        local_118 = CONCAT26(uVar26,(undefined6)local_118);
                        __assertion = "infos[e1_3_gobbo].atom_ix >= 0";
                        __file = 
                        "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/collision_frontend.cpp"
                        ;
                        __function = 
                        "int (anonymous namespace)::gobbo_are_1_3_connected(const struct atom_info *)"
                        ;
                        goto LAB_0011b115;
                      }
                      if (5 < local_104) {
                        uStack_120 = CONCAT62(uStack_120._2_6_,local_12e);
                        local_118._0_6_ = CONCAT24(local_12c,uVar3);
                        local_118 = CONCAT26(uVar26,(undefined6)local_118);
                        __assert_fail("infos[e1_3_gobbo].atom_ix < NUM_BB_ATOM",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/collision_frontend.cpp"
                                      ,0x8c,
                                      "int (anonymous namespace)::gobbo_are_1_3_connected(const struct atom_info *)"
                                     );
                      }
                      sVar20 = pRVar4[uVar25]._type;
                      uVar9 = (ulong)(local_100 < (int)uVar2);
                      uVar25 = (ulong)((int)uVar2 <= local_100);
                      iVar22 = local_128[uVar9 * 3] - local_128[uVar25 * 3];
                      if (1 < iVar22) goto LAB_0011ab1b;
                      if ((int)uVar3 < 6) {
                        iVar19 = local_128[uVar9 * 3 + 1];
                        sVar21 = sVar20;
                        if (*(int *)((anonymous_namespace)::bb_1_3 +
                                    (long)(iVar19 + iVar22 * 6) * 4 +
                                    (long)local_128[uVar25 * 3 + 1] * 0x30) == 0) {
                          if (iVar22 == 1) goto LAB_0011abd6;
                          goto LAB_0011ab1b;
                        }
                      }
                      else {
                        if (iVar22 != 1) {
                          uStack_120 = CONCAT62(uStack_120._2_6_,local_12e);
                          local_118._0_6_ = CONCAT24(local_12c,uVar3);
                          local_118 = CONCAT26(uVar26,(undefined6)local_118);
                          __assert_fail("delta_res == 1",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/collision_frontend.cpp"
                                        ,0xb1,
                                        "int (anonymous namespace)::gobbo_are_1_3_connected(const struct atom_info *)"
                                       );
                        }
                        if ((((uVar3 != 7) || (sVar20 != 0xc)) || (local_104 != 2)) ||
                           (sVar21 = 0xc, (int)uVar2 <= local_100)) {
                          iVar19 = local_128[uVar9 * 3 + 1];
LAB_0011abd6:
                          if ((iVar19 != 1) || (sVar21 = sVar20, local_128[uVar25 * 3 + 1] != 3))
                          goto LAB_0011ab1b;
                        }
                      }
                    }
                    else {
LAB_0011ab1b:
                      iVar22 = anon_unknown.dwarf_1fdf1::atoms_overlap
                                         (pAVar29,pAVar5 + uVar3,
                                          local_d8->m_ofac2[local_fc - uVar2 < 0xfffffffd]);
                      sVar21 = sVar20;
                      if (iVar22 != 0) {
                        local_f8 = (ulong)((int)local_f8 + (uint)(uVar24 < 6));
                        local_e0 = (ulong)(((int)local_e0 + 1) - (uint)(uVar24 < 6));
                        break;
                      }
                    }
LAB_0011ab4a:
                    lVar16 = lVar16 + 1;
                    sVar20 = sVar21;
                  } while (lVar27 + (ulong)(lVar27 == 0) != lVar16);
                }
                if (local_b8.
                    super__Vector_base<collision_grid_prot::atom_key,_std::allocator<collision_grid_prot::atom_key>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_b8.
                                  super__Vector_base<collision_grid_prot::atom_key,_std::allocator<collision_grid_prot::atom_key>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
                }
                sVar10 = pRVar17->_numAtom;
              }
              sVar23 = (short)uVar24 + 1;
              uVar24 = (uint)sVar23;
              uVar26 = local_12a;
              sVar20 = sVar21;
            } while (sVar23 < sVar10);
          }
          local_fc = CONCAT22(local_fc._2_2_,sVar21);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               Residue::Name3_abi_cxx11_[pRVar17->_type]._M_dataplus._M_p,
                               Residue::Name3_abi_cxx11_[pRVar17->_type]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,":",1);
          uVar25 = local_d0;
          poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,",",1);
          iVar22 = (int)local_f8;
          poVar13 = (ostream *)std::ostream::operator<<(poVar13,iVar22);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,",",1);
          iVar28 = (int)local_e0;
          poVar13 = (ostream *)std::ostream::operator<<(poVar13,iVar28);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,",",1);
          poVar13 = (ostream *)std::ostream::operator<<(poVar13,iVar28 + iVar22);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,",",1);
          iVar22 = local_108;
          plVar14 = (long *)std::ostream::operator<<(poVar13,local_108);
          std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
          std::ostream::put((char)plVar14);
          std::ostream::flush();
          local_e8 = local_e8 + (int)local_f8;
          iVar28 = local_c4 + iVar28;
          iVar22 = local_c0 + iVar22;
          uVar25 = uVar25 + 1;
          piVar15 = (local_a0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          local_12c = (short)local_fc;
          local_12e = local_12a;
        } while (uVar25 <= (ulong)(long)piVar15[local_88]);
      }
      lVar16 = local_88 + 1;
    } while (lVar16 != local_98);
    uStack_120 = CONCAT62(uStack_120._2_6_,local_12e);
    local_118._0_6_ = CONCAT24(local_12c,(undefined4)local_118);
    iVar19 = local_e8;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"TOTAL BB CLASHES: ",0x12);
  plVar14 = (long *)std::ostream::operator<<(&std::cout,iVar19);
  std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
  std::ostream::put((char)plVar14);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"TOTAL SC CLASHES: ",0x12);
  plVar14 = (long *)std::ostream::operator<<(&std::cout,iVar28);
  std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
  std::ostream::put((char)plVar14);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"TOTAL MEMB CLASHES: ",0x14);
  plVar14 = (long *)std::ostream::operator<<(&std::cout,iVar22);
  std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
  std::ostream::put((char)plVar14);
  std::ostream::flush();
  return;
}

Assistant:

void CollisionFrontend::print_broad_clash_counts(const class Structure &Conf,
    const std::vector<int> &starts,
    const std::vector<int> &ends,
    const bool b_ignore_self) const {
 
    assert(starts.size() == ends.size());   
    std::cout << "res,bbc,scc,tot,mc\n";
    
    // Structure used for detecting whether two backbone atoms are within two bonds or
    // less of each other
    struct atom_info infos[e1_3_num] = { 0 };

    // The overlap factor: If the ratio of distance between two atoms centers
    // to the sum of their atomic radii is less than this value, then the atoms
    // are colliding.
    double ofac2 = 1.0;
    
    const size_t num_loops = starts.size();

    // Total number of loop backbone atoms that clash with protein
    int total_bb_clashes = 0;
    // Total number of loop side chain atoms that clash with protein
    int total_sc_clashes = 0;
    // Total number of loop atoms that clash with membrane
    int total_memb_clashes = 0;

    for (size_t i_loop = 0; i_loop < num_loops; ++i_loop) {
        for (size_t i_res = starts[i_loop]; i_res <= ends[i_loop]; ++i_res) {
            const Residue &res = Conf._res[i_res];
            assert(res._posn == i_res);

            // Total number of backbone atoms at this residue that clash with protein
            int bb_clashes = 0;
            // Total number of side chain atoms at this residue that clash with protein
            int sc_clashes = 0;
            // Total number of atoms at this residue that clash with membrane
            int memb_clashes = 0;

            for (short i_atom = 0; i_atom < res._numAtom; ++i_atom) {
                // Obtain handle to atom
                const Atom &atom = res._atom[i_atom];
                if (VdwUtils::should_ignore_atom(atom)) {
                    continue;
                }

                // 1-3 collision filter for backbone atoms
                const bool is_bb_atom = (i_atom < NUM_BB_ATOM);
                if (is_bb_atom) {
                    infos[e1_3_gobbo].res_ix = static_cast<int>(i_res);
                    assert(infos[e1_3_gobbo].res_ix >= 1);
                    assert(infos[e1_3_gobbo].res_ix <= Conf._numRes);
                    infos[e1_3_gobbo].atom_ix = i_atom;
                    infos[e1_3_gobbo].res_type = Conf._res[infos[e1_3_gobbo].res_ix]._type;
                }

                // Check against membrane
                if (m_membrane.collides(atom, m_ofac2[eIxOFAC_memb])) {
                    ++memb_clashes;
                }

                // Broad phase
                collision_grid_prot::filter_results_t nearby_atoms;
                m_broad_phase.filter(nearby_atoms,
                                     atom.x, atom.y, atom.z,
                                     collision_grid_prot::elem_radius(atom));

                // Narrow phase
                const size_t num_nearby_atoms = nearby_atoms.size();
                for (size_t i_nearby_atom = 0; i_nearby_atom < num_nearby_atoms; ++i_nearby_atom) {
                    const collision_grid_prot::atom_key &nearby_atom_key = nearby_atoms[i_nearby_atom];
                    assert(nearby_atom_key.res_ix >= 1);
                    assert(nearby_atom_key.res_ix <= static_cast<unsigned int>(Conf._numRes));
                    assert(nearby_atom_key.atom_ix >= 0);
                    assert(nearby_atom_key.atom_ix < static_cast<unsigned int>(Conf._res[nearby_atom_key.res_ix]._numAtom));
                    const Atom &nearby_atom = Conf._res[nearby_atom_key.res_ix]._atom[nearby_atom_key.atom_ix];
                    assert(!VdwUtils::should_ignore_atom(nearby_atom));

                    // Skip self residues
                    if (b_ignore_self && (nearby_atom_key.res_ix == i_res)) {
                        continue;
                    }

                    // Skip if 1-3 connected (connected within at most 2 bonds)
                    // only supported if first atom is backbone atom
                    if (is_bb_atom)
                    {
                        infos[e1_3_alt].res_ix = nearby_atom_key.res_ix;
                        infos[e1_3_alt].atom_ix = nearby_atom_key.atom_ix;
                        infos[e1_3_alt].res_type = Conf._res[nearby_atom_key.res_ix]._type;
                        if (gobbo_are_1_3_connected(infos)) {
                            continue;
                        }

                        // HACK: Ca+1 and carbonyl O always seem to clash,
                        // even in native structure so ignore that specific interaction
                        if (hack_ignore_Ca1_with_O_clash(infos)) {
                            continue;
                        }
                    }

                    // Check for overlap
                    ofac2 = get_ofac2(static_cast<int>(i_res), static_cast<int>(nearby_atom_key.res_ix));
                    if (atoms_overlap(atom, nearby_atom, ofac2)) {
                        if (is_bb_atom) {
                            ++bb_clashes;
                        }
                        else {
                            ++sc_clashes;
                        }
                        // Check next atom for clashes
                        break;
                    }
                } // end narrow phase check

            } // end iteration over atoms

            std::cout << res.get_name_3() << ":" << i_res << ","
                      << bb_clashes << ","
                      << sc_clashes << ","
                      << bb_clashes + sc_clashes << ","
                      << memb_clashes << std::endl;

            total_bb_clashes += bb_clashes;
            total_sc_clashes += sc_clashes;
            total_memb_clashes += memb_clashes;

        } // end iteration over residues
    } // end iteration over loops

    std::cout << "TOTAL BB CLASHES: " << total_bb_clashes << std::endl;
    std::cout << "TOTAL SC CLASHES: " << total_sc_clashes << std::endl;
    std::cout << "TOTAL MEMB CLASHES: " << total_memb_clashes << std::endl;
}